

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_tiles.cpp
# Opt level: O1

void __thiscall CLayerTiles::~CLayerTiles(CLayerTiles *this)

{
  ~CLayerTiles(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

CLayerTiles::~CLayerTiles()
{
	delete [] m_pTiles;
	m_pTiles = 0;
	delete [] m_pSaveTiles;
	m_pSaveTiles = 0;
	m_SaveTilesSize = 0;
}